

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_CallFlowGraph.h
# Opt level: O1

CallSequenceCheckResults *
soul::CallFlowGraph::checkFunctionCallSequences
          (CallSequenceCheckResults *__return_storage_ptr__,Program *program)

{
  ProgramImpl *pPVar1;
  pointer ppVar2;
  size_t sVar3;
  pool_ref<soul::heart::Function> *ppVar4;
  pool_ref<soul::Module> *m;
  pointer ppVar5;
  long lVar6;
  pool_ref<soul::Module> *m_1;
  
  pPVar1 = program->pimpl;
  ppVar2 = (pPVar1->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (pPVar1->modules).
                super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    sVar3 = (ppVar5->object->functions).functions.numActive;
    if (sVar3 != 0) {
      ppVar4 = (ppVar5->object->functions).functions.items;
      lVar6 = 0;
      do {
        *(undefined8 *)(*(long *)((long)&ppVar4->object + lVar6) + 0xd8) = 0;
        lVar6 = lVar6 + 8;
      } while (sVar3 << 3 != lVar6);
    }
  }
  (__return_storage_ptr__->recursiveFunctionCallSequence).
  super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->recursiveFunctionCallSequence).
  super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->maximumStackSize = 0;
  (__return_storage_ptr__->recursiveFunctionCallSequence).
  super__Vector_base<soul::pool_ref<soul::heart::Function>,_std::allocator<soul::pool_ref<soul::heart::Function>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ppVar2 = (pPVar1->modules).
           super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar5 = (pPVar1->modules).
                super__Vector_base<soul::pool_ref<soul::Module>,_std::allocator<soul::pool_ref<soul::Module>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar5 != ppVar2; ppVar5 = ppVar5 + 1) {
    sVar3 = (ppVar5->object->functions).functions.numActive;
    if (sVar3 != 0) {
      ppVar4 = (ppVar5->object->functions).functions.items;
      lVar6 = 0;
      do {
        iterateCallSequences
                  (*(Function **)((long)&ppVar4->object + lVar6),__return_storage_ptr__,
                   (PreviousCall *)0x0,0);
        lVar6 = lVar6 + 8;
      } while (sVar3 << 3 != lVar6);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static CallSequenceCheckResults checkFunctionCallSequences (const Program& program)
    {
        for (auto& m : program.getModules())
            for (auto& f : m->functions.get())
                f->localVariableStackSize = 0;

        CallSequenceCheckResults results;

        for (auto& m : program.getModules())
            for (auto& f : m->functions.get())
                iterateCallSequences (f, results, nullptr, 0);

        return results;
    }